

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O3

void etdc_add(etdc_table **table,uint s)

{
  int *piVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_table *pUVar3;
  UT_hash_handle *pUVar4;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  long lVar7;
  etdc_table *peVar8;
  UT_hash_table *pUVar9;
  etdc_table *peVar10;
  UT_hash_bucket *pUVar11;
  uint uVar12;
  UT_hash_handle *pUVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint s_local;
  
  if (*table != (etdc_table *)0x0) {
    uVar15 = (int)(char)s +
             ((int)(short)s & 0xffffff00U) + (s & 0xff000000) + ((int)(s << 8) >> 8 & 0xffff0000U) +
             0x112410d ^ 0x7f76d;
    uVar12 = uVar15 << 8 ^ 0x9f49bac6 - uVar15;
    uVar18 = uVar12 >> 0xd ^ (-0x112410d - uVar15) - uVar12;
    uVar19 = uVar18 >> 0xc ^ (uVar15 - uVar12) - uVar18;
    uVar15 = uVar19 << 0x10 ^ (uVar12 - uVar18) - uVar19;
    uVar12 = uVar15 >> 5 ^ (uVar18 - uVar19) - uVar15;
    uVar18 = uVar12 >> 3 ^ (uVar19 - uVar15) - uVar12;
    uVar15 = uVar18 << 10 ^ (uVar15 - uVar12) - uVar18;
    pUVar9 = ((*table)->hh).tbl;
    pUVar13 = pUVar9->buckets
              [pUVar9->num_buckets - 1 & (uVar15 >> 0xf ^ uVar12 - (uVar18 + uVar15))].hh_head;
    if (pUVar13 != (UT_hash_handle *)0x0) {
      while ((lVar7 = pUVar9->hho, *(int *)((long)pUVar13 + (0x48 - lVar7)) != 4 ||
             (**(uint **)((long)pUVar13 + (0x40 - lVar7)) != s))) {
        pUVar13 = *(UT_hash_handle **)((long)pUVar13 + (0x38 - lVar7));
        if (pUVar13 == (UT_hash_handle *)0x0) {
          etdc_new_symbol(table,s);
          return;
        }
      }
      piVar1 = (int *)((long)pUVar13 + (4 - lVar7));
      *piVar1 = *piVar1 + 1;
      return;
    }
  }
  peVar8 = (etdc_table *)malloc(0x50);
  peVar8->symbol = s;
  peVar8->freq = 1;
  pUVar13 = &peVar8->hh;
  (peVar8->hh).next = (void *)0x0;
  (peVar8->hh).key = peVar8;
  (peVar8->hh).keylen = 4;
  if (*table == (etdc_table *)0x0) {
    *table = peVar8;
    (peVar8->hh).prev = (void *)0x0;
    pUVar9 = (UT_hash_table *)calloc(1,0x40);
    (peVar8->hh).tbl = pUVar9;
    if (pUVar9 == (UT_hash_table *)0x0) goto LAB_00101c07;
    pUVar9->tail = pUVar13;
    pUVar9->num_buckets = 0x20;
    pUVar9->log2_num_buckets = 5;
    pUVar9->hho = 0x18;
    pUVar11 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar9->buckets = pUVar11;
    if (pUVar11 == (UT_hash_bucket *)0x0) goto LAB_00101c07;
    pUVar9->signature = 0xa0111fe1;
    peVar10 = peVar8;
  }
  else {
    (((*table)->hh).tbl)->tail->next = peVar8;
    pUVar9 = ((*table)->hh).tbl;
    (peVar8->hh).prev = (void *)((long)pUVar9->tail - pUVar9->hho);
    pUVar9->tail = pUVar13;
    pUVar9 = ((*table)->hh).tbl;
    peVar10 = *table;
  }
  uVar18 = pUVar9->num_items + 1;
  pUVar9->num_items = uVar18;
  (peVar8->hh).tbl = pUVar9;
  uVar15 = (int)(char)peVar8->symbol +
           *(char *)((long)&peVar8->symbol + 1) * 0x100 +
           *(char *)((long)&peVar8->symbol + 2) * 0x10000 +
           (uint)*(byte *)((long)&peVar8->symbol + 3) * 0x1000000 + 0x112410d ^ 0x7f76d;
  uVar12 = uVar15 << 8 ^ 0x9f49bac6 - uVar15;
  uVar19 = uVar12 >> 0xd ^ (-0x112410d - uVar15) - uVar12;
  uVar17 = uVar19 >> 0xc ^ (uVar15 - uVar12) - uVar19;
  uVar15 = uVar17 << 0x10 ^ (uVar12 - uVar19) - uVar17;
  uVar12 = uVar15 >> 5 ^ (uVar19 - uVar17) - uVar15;
  uVar19 = uVar12 >> 3 ^ (uVar17 - uVar15) - uVar12;
  uVar15 = uVar19 << 10 ^ (uVar15 - uVar12) - uVar19;
  uVar12 = uVar15 >> 0xf ^ uVar12 - (uVar19 + uVar15);
  (peVar8->hh).hashv = uVar12;
  pUVar3 = (peVar10->hh).tbl;
  uVar12 = pUVar3->num_buckets - 1 & uVar12;
  pUVar11 = pUVar3->buckets;
  pUVar11[uVar12].count = pUVar11[uVar12].count + 1;
  pUVar4 = pUVar11[uVar12].hh_head;
  (peVar8->hh).hh_next = pUVar4;
  (peVar8->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar4 != (UT_hash_handle *)0x0) {
    pUVar4->hh_prev = pUVar13;
    pUVar11 = (((*table)->hh).tbl)->buckets;
  }
  pUVar11[uVar12].hh_head = pUVar13;
  pUVar11 = (((*table)->hh).tbl)->buckets;
  if ((pUVar11[uVar12].expand_mult * 10 + 10 <= pUVar11[uVar12].count) && (pUVar9->noexpand != 1)) {
    uVar12 = pUVar9->num_buckets;
    pUVar11 = (UT_hash_bucket *)calloc(1,(ulong)(uVar12 * 2) << 4);
    if (pUVar11 == (UT_hash_bucket *)0x0) {
LAB_00101c07:
      exit(-1);
    }
    uVar19 = uVar12 * 2 - 1;
    uVar15 = ((uVar18 >> ((char)pUVar9->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar19 & uVar18) == 0);
    pUVar9->ideal_chain_maxlen = uVar15;
    pUVar9->nonideal_items = 0;
    __ptr = pUVar9->buckets;
    if ((ulong)uVar12 != 0) {
      uVar18 = 0;
      uVar16 = 0;
      do {
        pUVar4 = __ptr[uVar16].hh_head;
        while (pUVar4 != (UT_hash_handle *)0x0) {
          pUVar5 = pUVar4->hh_next;
          uVar14 = pUVar4->hashv & uVar19;
          pUVar2 = pUVar11 + uVar14;
          uVar17 = pUVar11[uVar14].count + 1;
          pUVar11[uVar14].count = uVar17;
          if (uVar15 < uVar17) {
            uVar18 = uVar18 + 1;
            pUVar9->nonideal_items = uVar18;
            pUVar2->expand_mult = uVar17 / uVar15;
          }
          pUVar4->hh_prev = (UT_hash_handle *)0x0;
          pUVar6 = pUVar2->hh_head;
          pUVar4->hh_next = pUVar6;
          if (pUVar6 != (UT_hash_handle *)0x0) {
            pUVar6->hh_prev = pUVar4;
          }
          pUVar2->hh_head = pUVar4;
          pUVar4 = pUVar5;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar12);
    }
    free(__ptr);
    pUVar9 = pUVar13->tbl;
    pUVar9->num_buckets = pUVar9->num_buckets << 1;
    pUVar9->log2_num_buckets = pUVar9->log2_num_buckets + 1;
    pUVar9->buckets = pUVar11;
    if (pUVar9->num_items >> 1 < pUVar9->nonideal_items) {
      uVar12 = pUVar9->ineff_expands + 1;
      pUVar9->ineff_expands = uVar12;
      if (1 < uVar12) {
        pUVar9->noexpand = 1;
      }
    }
    else {
      pUVar9->ineff_expands = 0;
    }
  }
  return;
}

Assistant:

void etdc_add(struct etdc_table **table, unsigned int s) {
  struct etdc_table *e;

  HASH_FIND_INT( *table, &s, e);

  if (NULL == e) {
    //add symbol to table
    //fprintf(stderr,"No symbol found in table... creating one");
    etdc_new_symbol(table, s);
  } else {
    //increment frequency
    //fprintf(stderr,"Incrementing frequency of symbol in etdc table");
    e->freq++;
  }
}